

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_touch(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  jx9_real jVar4;
  jx9_value *pjVar5;
  jx9_real jVar6;
  anon_union_8_3_18420de5_for_x aVar7;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x100) != 0)) {
      pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
      jVar6 = -NAN;
      jVar4 = -NAN;
      if (nArg != 1) {
        pjVar5 = apArg[1];
        jx9MemObjToInteger(pjVar5);
        jVar6 = (pjVar5->x).rVal;
        jVar4 = jVar6;
        if (2 < (uint)nArg) {
          pjVar5 = apArg[1];
          jx9MemObjToInteger(pjVar5);
          jVar4 = (pjVar5->x).rVal;
        }
      }
      iVar2 = (**(code **)((long)pvVar1 + 0x100))(pcVar3,jVar6,jVar4);
      aVar7.iVal._1_7_ = 0;
      aVar7.iVal._0_1_ = iVar2 == 0;
      pjVar5 = pCtx->pRet;
      jx9MemObjRelease(pjVar5);
      pjVar5->x = aVar7;
      goto LAB_0013b07b;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
LAB_0013b07b:
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_touch(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nTime, nAccess;
	const char *zFile;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xTouch == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nTime = nAccess = -1;
	zFile = jx9_value_to_string(apArg[0], 0);
	if( nArg > 1 ){
		nTime = jx9_value_to_int64(apArg[1]);
		if( nArg > 2 ){
			nAccess = jx9_value_to_int64(apArg[1]);
		}else{
			nAccess = nTime;
		}
	}
	rc = pVfs->xTouch(zFile, nTime, nAccess);
	/* IO result */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}